

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

shared_ptr<peg::Ope> __thiscall
peg::cho<peg::Definition&,peg::Definition&>(peg *this,Definition *args,Definition *args_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<peg::Ope> sVar2;
  undefined1 local_69;
  PrioritizedChoice *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  WeakHolder *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<peg::Ope> local_48;
  shared_ptr<peg::Ope> local_38;
  
  local_58 = (WeakHolder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::WeakHolder,std::allocator<peg::WeakHolder>,std::shared_ptr<peg::Holder>&>
            (&_Stack_50,&local_58,(allocator<peg::WeakHolder> *)&local_48,&args->holder_);
  local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_58->super_Ope;
  local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_58 = (WeakHolder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::WeakHolder,std::allocator<peg::WeakHolder>,std::shared_ptr<peg::Holder>&>
            (&_Stack_50,&local_58,(allocator<peg::WeakHolder> *)&local_69,&args_1->holder_);
  local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_58->super_Ope;
  local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_68 = (PrioritizedChoice *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<peg::PrioritizedChoice,std::allocator<peg::PrioritizedChoice>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            (&local_60,&local_68,(allocator<peg::PrioritizedChoice> *)&local_58,&local_38,&local_48)
  ;
  _Var1._M_pi = local_60._M_pi;
  *(PrioritizedChoice **)this = local_68;
  *(undefined8 *)(this + 8) = 0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_68 = (PrioritizedChoice *)0x0;
  _Var1._M_pi = extraout_RDX;
  if (local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> cho(Args&& ...args) {
    return std::make_shared<PrioritizedChoice>(static_cast<std::shared_ptr<Ope>>(args)...);
}